

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Promise<void> __thiscall kj::joinPromises(kj *this,Array<kj::Promise<void>_> *promises)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  size_t sVar3;
  ExceptionOr<kj::_::Void> *pEVar4;
  undefined8 uVar5;
  Own<kj::_::PromiseNode> *pOVar6;
  Promise<void> *pPVar7;
  ArrayJoinPromiseNode<void> *pAVar8;
  ArrayJoinPromiseNode<void> *extraout_RDX;
  ArrayJoinPromiseNode<void> *extraout_RDX_00;
  Promise<void> *pPVar9;
  Own<kj::_::ArrayJoinPromiseNode<void>_> OVar10;
  Promise<void> PVar11;
  Array<kj::Own<kj::_::PromiseNode>_> result;
  Array<kj::Own<kj::_::PromiseNode>_> local_68;
  Array<kj::_::ExceptionOr<kj::_::Void>_> local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_68.ptr = (Own<kj::_::PromiseNode> *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x10,0,promises->size_,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
  local_48.size_ = promises->size_;
  pOVar6 = local_68.ptr;
  if (local_48.size_ != 0) {
    pPVar7 = promises->ptr;
    pPVar9 = pPVar7 + local_48.size_;
    do {
      pDVar1 = (pPVar7->super_PromiseBase).node.disposer;
      pPVar2 = (pPVar7->super_PromiseBase).node.ptr;
      (pPVar7->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      pOVar6->disposer = pDVar1;
      pOVar6->ptr = pPVar2;
      pOVar6 = pOVar6 + 1;
      pPVar7 = pPVar7 + 1;
    } while (pPVar7 != pPVar9);
  }
  local_68.size_ = (long)pOVar6 - (long)local_68.ptr >> 4;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.ptr = (ExceptionOr<kj::_::Void> *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x168,local_48.size_,local_48.size_,
                            _::HeapArrayDisposer::
                            Allocate_<kj::_::ExceptionOr<kj::_::Void>,_false,_false>::construct,
                            _::HeapArrayDisposer::
                            Allocate_<kj::_::ExceptionOr<kj::_::Void>,_false,_false>::destruct);
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  OVar10 = heap<kj::_::ArrayJoinPromiseNode<void>,kj::Array<kj::Own<kj::_::PromiseNode>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>>
                     ((kj *)&local_28,&local_68,&local_48);
  uVar5 = uStack_20;
  sVar3 = local_48.size_;
  pEVar4 = local_48.ptr;
  pAVar8 = OVar10.ptr;
  uStack_20 = 0;
  *(undefined8 *)this = local_28;
  *(undefined8 *)(this + 8) = uVar5;
  if (local_48.ptr != (ExceptionOr<kj::_::Void> *)0x0) {
    local_48.ptr = (ExceptionOr<kj::_::Void> *)0x0;
    local_48.size_ = 0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pEVar4,0x168,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>,_false>::destruct);
    pAVar8 = extraout_RDX;
  }
  sVar3 = local_68.size_;
  pOVar6 = local_68.ptr;
  if (local_68.ptr != (Own<kj::_::PromiseNode> *)0x0) {
    local_68.ptr = (Own<kj::_::PromiseNode> *)0x0;
    local_68.size_ = 0;
    (**(local_68.disposer)->_vptr_ArrayDisposer)
              (local_68.disposer,pOVar6,0x10,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode>,_false>::destruct);
    pAVar8 = extraout_RDX_00;
  }
  PVar11.super_PromiseBase.node.ptr = (PromiseNode *)pAVar8;
  PVar11.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar11.super_PromiseBase.node;
}

Assistant:

Promise<void> joinPromises(Array<Promise<void>>&& promises) {
  return Promise<void>(false, kj::heap<_::ArrayJoinPromiseNode<void>>(
      KJ_MAP(p, promises) { return kj::mv(p.node); },
      heapArray<_::ExceptionOr<_::Void>>(promises.size())));
}